

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

void mpack_writer_init_growable(mpack_writer_t *writer,char **target_data,size_t *target_size)

{
  char *pcVar1;
  char *buffer;
  size_t capacity;
  mpack_growable_writer_t *growable_writer;
  size_t *target_size_local;
  char **target_data_local;
  mpack_writer_t *writer_local;
  
  *target_data = (char *)0x0;
  *target_size = 0;
  pcVar1 = mpack_writer_get_reserved(writer);
  *(char ***)pcVar1 = target_data;
  *(size_t **)(pcVar1 + 8) = target_size;
  pcVar1 = (char *)malloc(0x1000);
  if (pcVar1 == (char *)0x0) {
    mpack_writer_init_error(writer,mpack_error_memory);
  }
  else {
    mpack_writer_init(writer,pcVar1,0x1000);
    mpack_writer_set_flush(writer,mpack_growable_writer_flush);
    mpack_writer_set_teardown(writer,mpack_growable_writer_teardown);
  }
  return;
}

Assistant:

void mpack_writer_init_growable(mpack_writer_t* writer, char** target_data, size_t* target_size) {
    mpack_assert(target_data != NULL, "cannot initialize writer without a destination for the data");
    mpack_assert(target_size != NULL, "cannot initialize writer without a destination for the size");

    *target_data = NULL;
    *target_size = 0;

    MPACK_STATIC_ASSERT(sizeof(mpack_growable_writer_t) <= sizeof(writer->reserved),
            "not enough reserved space for growable writer!");
    mpack_growable_writer_t* growable_writer = (mpack_growable_writer_t*)mpack_writer_get_reserved(writer);

    growable_writer->target_data = target_data;
    growable_writer->target_size = target_size;

    size_t capacity = MPACK_BUFFER_SIZE;
    char* buffer = (char*)MPACK_MALLOC(capacity);
    if (buffer == NULL) {
        mpack_writer_init_error(writer, mpack_error_memory);
        return;
    }

    mpack_writer_init(writer, buffer, capacity);
    mpack_writer_set_flush(writer, mpack_growable_writer_flush);
    mpack_writer_set_teardown(writer, mpack_growable_writer_teardown);
}